

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O3

string * __thiscall
benchmark::ExponentToPrefix_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,int64_t exponent,bool iec)

{
  long lVar1;
  benchmark *pbVar2;
  long *plVar3;
  undefined7 in_register_00000009;
  benchmark *pbVar4;
  size_type *psVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pbVar4 = (benchmark *)CONCAT71(in_register_00000009,iec);
  if (this != (benchmark *)0x0) {
    pbVar4 = this + -1;
    pbVar2 = (benchmark *)~(ulong)this;
    if (0 < (long)this) {
      pbVar2 = pbVar4;
    }
    if ((long)pbVar2 < 9) {
      if ((char)exponent == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
        return __return_storage_ptr__;
      }
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"i","");
      plVar3 = (long *)std::__cxx11::string::insert((ulong)local_40,0,'\x01');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0]);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","",pbVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string ExponentToPrefix(int64_t exponent, bool iec) {
  if (exponent == 0) return "";

  const int64_t index = (exponent > 0 ? exponent - 1 : -exponent - 1);
  if (index >= kUnitsSize) return "";

  const char* array =
      (exponent > 0 ? (iec ? kBigIECUnits : kBigSIUnits) : kSmallSIUnits);
  if (iec)
    return array[index] + std::string("i");
  else
    return std::string(1, array[index]);
}